

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int *piVar8;
  pointer piVar9;
  Mat *pMVar10;
  Mat *pMVar11;
  int k;
  Mat *pMVar12;
  ulong uVar13;
  uint top;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  _func_int ***ppp_Var20;
  float *pfVar21;
  _func_int ***ppp_Var22;
  int j;
  int iVar23;
  uint uVar24;
  int q;
  void *pvVar25;
  int iVar26;
  int iVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  allocator_type local_1a9;
  Mat *local_1a8;
  LRN_x86_avx *local_1a0;
  Mat local_198;
  Mat *local_150;
  _func_int ***local_148;
  Mat *local_140;
  undefined1 local_138 [16];
  Mat local_128;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Allocator *local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  Mat *local_90;
  long local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar5 = _local_d8;
  local_d8._4_4_ = 0;
  local_d8._0_4_ = bottom_top_blob->w;
  local_1a8 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  ppp_Var20 = (_func_int ***)bottom_top_blob->elemsize;
  local_128.cstep = 0;
  local_128.data = (Allocator *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_128.elempack = 0;
  _fStack_d0 = auVar5._8_24_;
  local_1a0 = (LRN_x86_avx *)CONCAT44(local_1a0._4_4_,bottom_top_blob->c);
  local_128.allocator = (Allocator *)local_128.data;
  local_128.dims = (int)local_128.refcount;
  local_128.w = local_128.refcount._4_4_;
  local_128._48_8_ = local_128.elemsize;
  local_128.c = local_128.elempack;
  Mat::create(&local_128,bottom_top_blob->w,bottom_top_blob->h,bottom_top_blob->c,(size_t)ppp_Var20,
              opt->workspace_allocator);
  iVar23 = -100;
  if (((Allocator *)local_128.data == (Allocator *)0x0) ||
     ((long)local_128.c * local_128.cstep == 0)) goto LAB_002ef4a7;
  local_138._0_8_ = opt;
  iVar27 = local_d8._0_4_;
  local_80 = (long)iVar27;
  iVar23 = (int)local_1a8 * iVar27;
  pMVar10 = (Mat *)0x0;
  local_150 = (Mat *)0x0;
  if (0 < (int)local_1a0) {
    local_150 = (Mat *)((ulong)local_1a0 & 0xffffffff);
  }
  for (; pMVar10 != local_150; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
    pvVar25 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pfVar21 = (float *)(sVar3 * (long)pMVar10 * sVar2 + (long)pvVar25);
    ppp_Var22 = (_func_int ***)
                ((long)(_func_int ***)local_128.data +
                local_128.cstep * (long)pMVar10 * local_128.elemsize);
    lVar17 = 0;
    for (iVar26 = 0; iVar26 + 7 < iVar23; iVar26 = iVar26 + 8) {
      auVar5._4_4_ = pfVar21[1] * pfVar21[1];
      auVar5._0_4_ = *pfVar21 * *pfVar21;
      auVar5._8_4_ = pfVar21[2] * pfVar21[2];
      auVar5._12_4_ = pfVar21[3] * pfVar21[3];
      auVar5._16_4_ = pfVar21[4] * pfVar21[4];
      auVar5._20_4_ = pfVar21[5] * pfVar21[5];
      auVar5._24_4_ = pfVar21[6] * pfVar21[6];
      auVar5._28_4_ = pfVar21[7];
      *(undefined1 (*) [32])ppp_Var22 = auVar5;
      pfVar21 = pfVar21 + 8;
      ppp_Var22 = ppp_Var22 + 4;
      lVar17 = lVar17 + 8;
    }
    for (; (int)lVar17 < iVar23; lVar17 = lVar17 + 1) {
      fVar28 = *(float *)((long)pvVar25 + lVar17 * 4 + sVar3 * sVar2 * (long)pMVar10);
      *(float *)((long)(_func_int ***)local_128.data +
                lVar17 * 4 + local_128.cstep * local_128.elemsize * (long)pMVar10) = fVar28 * fVar28
      ;
    }
  }
  iVar26 = (this->super_LRN).region_type;
  local_148 = ppp_Var20;
  if (iVar26 == 0) {
    local_198.cstep = 0;
    local_198.data = (Allocator *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,iVar27,(int)local_1a8,(int)local_1a0,(size_t)ppp_Var20,
                opt->workspace_allocator);
    if (((Allocator *)local_198.data == (Allocator *)0x0) ||
       (local_198.cstep * (long)local_198.c == 0)) {
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
      iVar23 = -100;
      if (piVar8 == (int *)0x0) goto LAB_002ef4a7;
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) goto LAB_002ef4a7;
      if (local_198.allocator != (Allocator *)0x0) {
        (*(local_198.allocator)->_vptr_Allocator[3])();
        goto LAB_002ef4a7;
      }
LAB_002ef4fb:
      iVar23 = -100;
      free(local_198.data);
      goto LAB_002ef4a7;
    }
    uVar24 = (int)local_198.cstep * local_198.c;
    uVar14 = 0;
    uVar13 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar13 = uVar14;
    }
    for (; (int)uVar13 != (int)uVar14; uVar14 = uVar14 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_198.data + uVar14 * 4) = 0;
    }
    local_138._0_4_ = (this->super_LRN).alpha / (float)(this->super_LRN).local_size;
    local_138._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar47 = vshufps_avx(local_138,local_138,0);
    register0x00001210 = auVar47;
    _local_d8 = auVar47;
    local_140 = bottom_top_blob;
    for (pMVar10 = (Mat *)0x0; pvVar25 = local_198.data, pMVar10 != local_150;
        pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
      iVar27 = (this->super_LRN).local_size;
      for (uVar24 = iVar27 / -2 + (int)pMVar10; (int)uVar24 <= iVar27 / 2 + (int)pMVar10;
          uVar24 = uVar24 + 1) {
        if ((int)uVar24 < (int)local_1a0 && -1 < (int)uVar24) {
          ppp_Var22 = (_func_int ***)
                      ((long)(_func_int ***)local_128.data +
                      local_128.cstep * uVar24 * local_128.elemsize);
          lVar19 = local_198.cstep * (long)pMVar10 *
                   CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          ppp_Var20 = (_func_int ***)((long)(_func_int ***)local_198.data + lVar19);
          lVar17 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar23; iVar27 = iVar27 + 8) {
            auVar29._0_4_ = *(float *)ppp_Var20 + *(float *)ppp_Var22;
            auVar29._4_4_ = *(float *)((long)ppp_Var20 + 4) + *(float *)((long)ppp_Var22 + 4);
            auVar29._8_4_ = *(float *)(ppp_Var20 + 1) + *(float *)(ppp_Var22 + 1);
            auVar29._12_4_ =
                 *(float *)((long)(ppp_Var20 + 1) + 4) + *(float *)((long)(ppp_Var22 + 1) + 4);
            auVar29._16_4_ = *(float *)(ppp_Var20 + 2) + *(float *)(ppp_Var22 + 2);
            auVar29._20_4_ =
                 *(float *)((long)(ppp_Var20 + 2) + 4) + *(float *)((long)(ppp_Var22 + 2) + 4);
            auVar29._24_4_ = *(float *)(ppp_Var20 + 3) + *(float *)(ppp_Var22 + 3);
            auVar29._28_4_ =
                 *(float *)((long)(ppp_Var20 + 3) + 4) + *(float *)((long)(ppp_Var22 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var20 = auVar29;
            ppp_Var22 = ppp_Var22 + 4;
            ppp_Var20 = ppp_Var20 + 4;
            lVar17 = lVar17 + 8;
          }
          for (; (int)lVar17 < iVar23; lVar17 = lVar17 + 1) {
            *(float *)((long)(_func_int ***)local_198.data + lVar17 * 4 + lVar19) =
                 *(float *)((long)(_func_int ***)local_198.data + lVar17 * 4 + lVar19) +
                 *(float *)((long)(_func_int ***)local_128.data +
                           lVar17 * 4 + local_128.cstep * local_128.elemsize * (ulong)uVar24);
          }
          iVar27 = (this->super_LRN).local_size;
        }
      }
      pvVar4 = local_140->data;
      sVar2 = local_140->elemsize;
      sVar3 = local_140->cstep;
      pfVar21 = (float *)(sVar3 * (long)pMVar10 * sVar2 + (long)pvVar4);
      ppp_Var20 = (_func_int ***)
                  ((long)(_func_int ***)local_198.data +
                  local_198.cstep * (long)pMVar10 *
                  CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
      fVar28 = (this->super_LRN).bias;
      fVar1 = (this->super_LRN).beta;
      uVar13 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
      lVar17 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar23; iVar27 = iVar27 + 8) {
        auVar30._0_4_ = (float)local_d8._0_4_ * *(float *)ppp_Var20 + fVar28;
        auVar30._4_4_ = (float)local_d8._4_4_ * *(float *)((long)ppp_Var20 + 4) + fVar28;
        auVar30._8_4_ = fStack_d0 * *(float *)(ppp_Var20 + 1) + fVar28;
        auVar30._12_4_ = fStack_cc * *(float *)((long)(ppp_Var20 + 1) + 4) + fVar28;
        auVar30._16_4_ = fStack_c8 * *(float *)(ppp_Var20 + 2) + fVar28;
        auVar30._20_4_ = fStack_c4 * *(float *)((long)(ppp_Var20 + 2) + 4) + fVar28;
        auVar30._24_4_ = fStack_c0 * *(float *)(ppp_Var20 + 3) + fVar28;
        auVar30._28_4_ = fStack_bc + fVar28;
        auVar32._8_4_ = 0x800000;
        auVar32._0_8_ = 0x80000000800000;
        auVar32._12_4_ = 0x800000;
        auVar32._16_4_ = 0x800000;
        auVar32._20_4_ = 0x800000;
        auVar32._24_4_ = 0x800000;
        auVar32._28_4_ = 0x800000;
        auVar6 = vmaxps_avx(auVar30,auVar32);
        auVar47 = vpsrld_avx(auVar6._16_16_,0x17);
        auVar33._8_4_ = 0x807fffff;
        auVar33._0_8_ = 0x807fffff807fffff;
        auVar33._12_4_ = 0x807fffff;
        auVar33._16_4_ = 0x807fffff;
        auVar33._20_4_ = 0x807fffff;
        auVar33._24_4_ = 0x807fffff;
        auVar33._28_4_ = 0x807fffff;
        auVar5 = vandps_avx(auVar6,auVar33);
        auVar52._8_4_ = 0x3f000000;
        auVar52._0_8_ = 0x3f0000003f000000;
        auVar52._12_4_ = 0x3f000000;
        auVar52._16_4_ = 0x3f000000;
        auVar52._20_4_ = 0x3f000000;
        auVar52._24_4_ = 0x3f000000;
        auVar52._28_4_ = 0x3f000000;
        auVar7 = vorps_avx(auVar52,auVar5);
        auVar49._8_4_ = 0x3f3504f3;
        auVar49._0_8_ = 0x3f3504f33f3504f3;
        auVar49._12_4_ = 0x3f3504f3;
        auVar49._16_4_ = 0x3f3504f3;
        auVar49._20_4_ = 0x3f3504f3;
        auVar49._24_4_ = 0x3f3504f3;
        auVar49._28_4_ = 0x3f3504f3;
        auVar29 = vcmpps_avx(auVar49,auVar7,2);
        auVar5 = vandnps_avx(auVar29,auVar7);
        fVar31 = auVar7._0_4_ + -1.0 + auVar5._0_4_;
        fVar39 = auVar7._4_4_ + -1.0 + auVar5._4_4_;
        fVar40 = auVar7._8_4_ + -1.0 + auVar5._8_4_;
        fVar41 = auVar7._12_4_ + -1.0 + auVar5._12_4_;
        fVar42 = auVar7._16_4_ + -1.0 + auVar5._16_4_;
        fVar43 = auVar7._20_4_ + -1.0 + auVar5._20_4_;
        fVar44 = auVar7._24_4_ + -1.0 + auVar5._24_4_;
        auVar47 = vpsubd_avx(auVar47,auVar29._16_16_);
        auVar45 = vpsrld_avx(auVar6._0_16_,0x17);
        auVar50._8_4_ = 0xffffff81;
        auVar50._0_8_ = 0xffffff81ffffff81;
        auVar50._12_4_ = 0xffffff81;
        auVar47 = vpaddd_avx(auVar47,auVar50);
        auVar45 = vpsubd_avx(auVar45,auVar29._0_16_);
        auVar45 = vpaddd_avx(auVar45,auVar50);
        auVar46._16_16_ = auVar47;
        auVar46._0_16_ = auVar45;
        auVar29 = vcmpps_avx(auVar30,_DAT_0053ad40,2);
        auVar6 = vcvtdq2ps_avx(auVar46);
        auVar34._0_4_ =
             auVar6._0_4_ * 0.6931472 + fVar31 +
             fVar31 * fVar31 *
             (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) * fVar31 +
                   -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057) * fVar31 + 0.20000714
                ) * fVar31 + -0.24999994) * fVar31 + 0.3333333) * fVar31 + -0.5);
        auVar34._4_4_ =
             auVar6._4_4_ * 0.6931472 + fVar39 +
             fVar39 * fVar39 *
             (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                   -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 + 0.20000714
                ) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5);
        auVar34._8_4_ =
             auVar6._8_4_ * 0.6931472 + fVar40 +
             fVar40 * fVar40 *
             (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                   -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 + 0.20000714
                ) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5);
        auVar34._12_4_ =
             auVar6._12_4_ * 0.6931472 + fVar41 +
             fVar41 * fVar41 *
             (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                   -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714
                ) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5);
        auVar34._16_4_ =
             auVar6._16_4_ * 0.6931472 + fVar42 +
             fVar42 * fVar42 *
             (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                   -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 + 0.20000714
                ) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5);
        auVar34._20_4_ =
             auVar6._20_4_ * 0.6931472 + fVar43 +
             fVar43 * fVar43 *
             (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                   -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 + 0.20000714
                ) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5);
        auVar34._24_4_ =
             auVar6._24_4_ * 0.6931472 + fVar44 +
             fVar44 * fVar44 *
             (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                   -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 + 0.20000714
                ) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5);
        auVar34._28_4_ = auVar6._28_4_ + auVar7._28_4_ + -1.0 + auVar5._28_4_ + 0.0;
        auVar5 = vorps_avx(auVar29,auVar34);
        fVar31 = (float)uVar13;
        fVar39 = (float)(uVar13 >> 0x20);
        auVar6._4_4_ = auVar5._4_4_ * fVar39;
        auVar6._0_4_ = auVar5._0_4_ * fVar31;
        auVar6._8_4_ = auVar5._8_4_ * -fVar1;
        auVar6._12_4_ = auVar5._12_4_ * -fVar1;
        auVar6._16_4_ = auVar5._16_4_ * fVar31;
        auVar6._20_4_ = auVar5._20_4_ * fVar39;
        auVar6._24_4_ = auVar5._24_4_ * -fVar1;
        auVar6._28_4_ = auVar5._28_4_;
        auVar35._8_4_ = 0x42b0c0a5;
        auVar35._0_8_ = 0x42b0c0a542b0c0a5;
        auVar35._12_4_ = 0x42b0c0a5;
        auVar35._16_4_ = 0x42b0c0a5;
        auVar35._20_4_ = 0x42b0c0a5;
        auVar35._24_4_ = 0x42b0c0a5;
        auVar35._28_4_ = 0x42b0c0a5;
        auVar5 = vminps_avx(auVar6,auVar35);
        auVar36._8_4_ = 0xc2b0c0a5;
        auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar36._12_4_ = 0xc2b0c0a5;
        auVar36._16_4_ = 0xc2b0c0a5;
        auVar36._20_4_ = 0xc2b0c0a5;
        auVar36._24_4_ = 0xc2b0c0a5;
        auVar36._28_4_ = 0xc2b0c0a5;
        auVar29 = vmaxps_avx(auVar5,auVar36);
        auVar37._0_4_ = auVar29._0_4_ * 1.442695 + 0.5;
        auVar37._4_4_ = auVar29._4_4_ * 1.442695 + 0.5;
        auVar37._8_4_ = auVar29._8_4_ * 1.442695 + 0.5;
        auVar37._12_4_ = auVar29._12_4_ * 1.442695 + 0.5;
        auVar37._16_4_ = auVar29._16_4_ * 1.442695 + 0.5;
        auVar37._20_4_ = auVar29._20_4_ * 1.442695 + 0.5;
        auVar37._24_4_ = auVar29._24_4_ * 1.442695 + 0.5;
        auVar37._28_4_ = 0x3ff8aa3b;
        auVar6 = vroundps_avx(auVar37,1);
        auVar5 = vcmpps_avx(auVar37,auVar6,1);
        auVar51._8_4_ = 0x3f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._12_4_ = 0x3f800000;
        auVar51._16_4_ = 0x3f800000;
        auVar51._20_4_ = 0x3f800000;
        auVar51._24_4_ = 0x3f800000;
        auVar51._28_4_ = 0x3f800000;
        auVar5 = vandps_avx(auVar5,auVar51);
        auVar5 = vsubps_avx(auVar6,auVar5);
        auVar7._4_4_ = auVar5._4_4_ * 0.6931472;
        auVar7._0_4_ = auVar5._0_4_ * 0.6931472;
        auVar7._8_4_ = auVar5._8_4_ * 0.6931472;
        auVar7._12_4_ = auVar5._12_4_ * 0.6931472;
        auVar7._16_4_ = auVar5._16_4_ * 0.6931472;
        auVar7._20_4_ = auVar5._20_4_ * 0.6931472;
        auVar7._24_4_ = auVar5._24_4_ * 0.6931472;
        auVar7._28_4_ = auVar6._28_4_;
        auVar29 = vsubps_avx(auVar29,auVar7);
        fVar31 = auVar29._0_4_;
        fVar39 = auVar29._4_4_;
        fVar40 = auVar29._8_4_;
        fVar41 = auVar29._12_4_;
        fVar42 = auVar29._16_4_;
        fVar43 = auVar29._20_4_;
        fVar44 = auVar29._24_4_;
        auVar47._0_4_ = (int)auVar5._0_4_;
        auVar47._4_4_ = (int)auVar5._4_4_;
        auVar47._8_4_ = (int)auVar5._8_4_;
        auVar47._12_4_ = (int)auVar5._12_4_;
        auVar38._16_4_ = (int)auVar5._16_4_;
        auVar38._0_16_ = auVar47;
        auVar38._20_4_ = (int)auVar5._20_4_;
        auVar38._24_4_ = (int)auVar5._24_4_;
        auVar38._28_4_ = (int)auVar5._28_4_;
        auVar45 = vpslld_avx(auVar47,0x17);
        auVar47 = vpslld_avx(auVar38._16_16_,0x17);
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar47 = vpaddd_avx(auVar47,auVar48);
        auVar45 = vpaddd_avx(auVar45,auVar48);
        *pfVar21 = auVar45._0_4_ * *pfVar21 *
                   (fVar31 + 1.0 +
                   fVar31 * fVar31 *
                   (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                     0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5));
        pfVar21[1] = auVar45._4_4_ * pfVar21[1] *
                     (fVar39 + 1.0 +
                     fVar39 * fVar39 *
                     (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                       0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5));
        pfVar21[2] = auVar45._8_4_ * pfVar21[2] *
                     (fVar40 + 1.0 +
                     fVar40 * fVar40 *
                     (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                       0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5));
        pfVar21[3] = auVar45._12_4_ * pfVar21[3] *
                     (fVar41 + 1.0 +
                     fVar41 * fVar41 *
                     (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                       0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5));
        pfVar21[4] = auVar47._0_4_ * pfVar21[4] *
                     (fVar42 + 1.0 +
                     fVar42 * fVar42 *
                     (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                       0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5));
        pfVar21[5] = auVar47._4_4_ * pfVar21[5] *
                     (fVar43 + 1.0 +
                     fVar43 * fVar43 *
                     (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                       0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5));
        pfVar21[6] = auVar47._8_4_ * pfVar21[6] *
                     (fVar44 + 1.0 +
                     fVar44 * fVar44 *
                     (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                       0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5));
        pfVar21[7] = auVar29._28_4_ + 1.0 + auVar6._28_4_;
        ppp_Var20 = ppp_Var20 + 4;
        pfVar21 = pfVar21 + 8;
        lVar17 = lVar17 + 8;
      }
      lVar19 = sVar3 * sVar2 * (long)pMVar10;
      lVar15 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      for (; (int)lVar17 < iVar23; lVar17 = lVar17 + 1) {
        fVar28 = powf((float)local_138._0_4_ *
                      *(float *)((long)(_func_int ***)pvVar25 + lVar17 * 4 + lVar15 * (long)pMVar10)
                      + (this->super_LRN).bias,-(this->super_LRN).beta);
        *(float *)((long)pvVar4 + lVar17 * 4 + lVar19) =
             fVar28 * *(float *)((long)pvVar4 + lVar17 * 4 + lVar19);
      }
    }
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) goto LAB_002ef49a;
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar23 = 0;
    if (iVar26 != 1) goto LAB_002ef4a7;
    piVar8 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    local_198.data = local_128.data;
    local_198.refcount._0_4_ = (int)local_128.refcount;
    local_198.refcount._4_4_ = local_128.refcount._4_4_;
    local_198.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_198.elemsize._4_4_ = (undefined4)(local_128.elemsize >> 0x20);
    local_198.elempack = local_128.elempack;
    local_198.allocator = local_128.allocator;
    local_198.dims = local_128.dims;
    local_198.w = local_128.w;
    local_198.h = local_128.h;
    local_198.d = local_128.d;
    local_198.c = local_128.c;
    local_198.cstep = local_128.cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    uVar24 = (this->super_LRN).local_size;
    if (1 < (int)uVar24) {
      top = uVar24 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_128,&local_198,top,~top + uVar24,top,~top + uVar24,0,0.0,
                       (Option *)&_space_ofs);
      iVar23 = -100;
      if (((Allocator *)local_198.data == (Allocator *)0x0) ||
         ((long)local_198.c * local_198.cstep == 0)) {
        piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
        if (piVar8 == (int *)0x0) goto LAB_002ef4a7;
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 != 0) goto LAB_002ef4a7;
        if (local_198.allocator != (Allocator *)0x0) {
          (*(local_198.allocator)->_vptr_Allocator[3])();
          goto LAB_002ef4a7;
        }
        goto LAB_002ef4fb;
      }
      uVar24 = (this->super_LRN).local_size;
      iVar27 = local_198.w;
    }
    uVar24 = uVar24 * uVar24;
    local_138._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar24,&local_1a9);
    piVar9 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar23 = (this->super_LRN).local_size;
    iVar27 = iVar27 - iVar23;
    lVar17 = 0;
    iVar26 = 0;
    for (iVar16 = 0; iVar16 < iVar23; iVar16 = iVar16 + 1) {
      for (lVar19 = 0; iVar18 = (int)lVar19, iVar18 < iVar23; lVar19 = lVar19 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar17 + lVar19] = iVar26 + iVar18;
        iVar23 = (this->super_LRN).local_size;
      }
      iVar26 = iVar26 + iVar27 + iVar18;
      lVar17 = (int)lVar17 + lVar19;
    }
    local_98 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_a0 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
    local_88 = (long)local_198.w * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
    ;
    pMVar12 = (Mat *)0x0;
    pMVar10 = (Mat *)((ulong)local_d8 & 0xffffffff);
    if (local_d8._0_4_ < 1) {
      pMVar10 = pMVar12;
    }
    local_a8 = bottom_top_blob->data;
    iVar23 = (int)local_1a8;
    local_1a8 = (Mat *)((ulong)local_1a8 & 0xffffffff);
    if (iVar23 < 1) {
      local_1a8 = pMVar12;
    }
    local_b0 = (Allocator *)local_198.data;
    local_d8._0_4_ = 1.0 / (float)(int)uVar24;
    local_1a0 = this;
    while (pMVar12 != local_150) {
      pvVar25 = (void *)(local_98 * (long)pMVar12 + (long)local_a8);
      local_148 = (_func_int ***)((long)&local_b0->_vptr_Allocator + local_a0 * (long)pMVar12);
      pMVar11 = (Mat *)0x0;
      local_90 = pMVar12;
      while (ppp_Var20 = local_148, pMVar11 != local_1a8) {
        lVar17 = local_88 * (long)pMVar11;
        local_140 = pMVar11;
        for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar10; pMVar12 = (Mat *)((long)&pMVar12->data + 1))
        {
          fVar28 = 0.0;
          for (uVar13 = 0; uVar24 != uVar13; uVar13 = uVar13 + 1) {
            fVar28 = fVar28 + *(float *)((long)ppp_Var20 +
                                        (long)piVar9[uVar13] * 4 + (long)pMVar12 * 4 + lVar17);
          }
          fVar28 = powf(fVar28 * (float)local_138._0_4_ * (float)local_d8._0_4_ +
                        (local_1a0->super_LRN).bias,-(local_1a0->super_LRN).beta);
          *(float *)((long)pvVar25 + (long)pMVar12 * 4) =
               fVar28 * *(float *)((long)pvVar25 + (long)pMVar12 * 4);
        }
        pvVar25 = (void *)((long)pvVar25 + local_80 * 4);
        pMVar11 = (Mat *)((long)&local_140->data + 1);
      }
      pMVar12 = (Mat *)((long)&local_90->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
LAB_002ef49a:
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar23 = 0;
LAB_002ef4a7:
  piVar8 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}